

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O2

Type __thiscall ON_ModelComponentTypeIterator::PreviousType(ON_ModelComponentTypeIterator *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = this->m_type_count;
  uVar2 = this->m_current_index;
  if (0 < (int)uVar1) {
    uVar3 = uVar1;
    if ((uVar2 != 0x80000001) && (uVar3 = uVar2, (int)uVar2 < 0)) {
      return Unset;
    }
    uVar2 = uVar3 - 1;
    this->m_current_index = uVar2;
  }
  if ((int)uVar1 <= (int)uVar2 || (int)uVar2 < 0) {
    return Unset;
  }
  return this->m_types[uVar2];
}

Assistant:

ON_ModelComponent::Type ON_ModelComponentTypeIterator::PreviousType()
{
  if (m_type_count > 0)
  {
    if (ON_UNSET_INT_INDEX == m_current_index)
      m_current_index = m_type_count-1;
    else if (m_current_index >= 0)
      m_current_index--;
  }
  return CurrentType();
}